

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ootake_PSG.c
# Opt level: O0

void OPSG_Mix(void *chip,UINT32 nSample,DEV_SMPL **pDst)

{
  DEV_SMPL *pDVar1;
  DEV_SMPL *pDVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  DEV_SMPL *bufR;
  DEV_SMPL *bufL;
  Sint32 smp;
  Sint32 sampleAllR;
  Sint32 sampleAllL;
  Sint32 sample;
  Uint32 j;
  Sint32 i;
  PSG *PSGChn;
  huc6280_state *info;
  DEV_SMPL **pDst_local;
  UINT32 nSample_local;
  void *chip_local;
  
  pDVar1 = *pDst;
  pDVar2 = pDst[1];
  for (sampleAllL = 0; (uint)sampleAllL < nSample; sampleAllL = sampleAllL + 1) {
    smp = 0;
    bufL._4_4_ = 0;
    for (sample = 0; sample < 6; sample = sample + 1) {
      puVar5 = (uint *)((long)chip + (long)sample * 0xb8 + 0x20);
      if (((char)puVar5[1] != '\0') &&
         (((sample != 1 || (*(int *)((long)chip + 0x634) == 0)) &&
          (*(char *)((long)chip + (long)sample + 0x650) == '\0')))) {
        if (*(char *)((long)puVar5 + 5) == '\0') {
          if ((char)puVar5[0x2b] == '\0') {
            if (puVar5[0x2a] != 0) {
              sampleAllR = puVar5[(ulong)(puVar5[0x29] >> 0x1b) + 7];
              inc_phase((huc6280_state *)chip,sample);
              if (*puVar5 < 0x80) {
                sampleAllR = sampleAllR - (sampleAllR >> 2);
              }
              smp = sampleAllR * puVar5[5] + smp;
              bufL._4_4_ = sampleAllR * puVar5[6] + bufL._4_4_;
            }
          }
          else {
            iVar3 = _NoiseTable[puVar5[0x29] >> 0x11];
            puVar5[0x29] = puVar5[0x2d] + puVar5[0x29];
            if (puVar5[0x2c] == 0) {
              iVar4 = iVar3 * puVar5[5];
              iVar4 = (iVar4 >> 1) + (iVar4 >> 0xc) + (iVar4 >> 0xe);
              iVar3 = iVar3 * puVar5[6];
              iVar3 = (iVar3 >> 1) + (iVar3 >> 0xc) + (iVar3 >> 0xe);
            }
            else {
              iVar4 = iVar3 * puVar5[5];
              iVar4 = iVar4 + (iVar4 >> 0xb) + (iVar4 >> 0xe) + (iVar4 >> 0xf);
              iVar3 = iVar3 * puVar5[6];
              iVar3 = iVar3 + (iVar3 >> 0xb) + (iVar3 >> 0xe) + (iVar3 >> 0xf);
            }
            smp = iVar4 + smp;
            bufL._4_4_ = iVar3 + bufL._4_4_;
          }
        }
        else {
          iVar3 = puVar5[0x28] * puVar5[5];
          smp = iVar3 + (iVar3 >> 3) + (iVar3 >> 4) + (iVar3 >> 5) + (iVar3 >> 7) + (iVar3 >> 0xc) +
                (iVar3 >> 0xe) + (iVar3 >> 0xf) + smp;
          iVar3 = puVar5[0x28] * puVar5[6];
          bufL._4_4_ = iVar3 + (iVar3 >> 3) + (iVar3 >> 4) + (iVar3 >> 5) + (iVar3 >> 7) +
                       (iVar3 >> 0xc) + (iVar3 >> 0xe) + (iVar3 >> 0xf) + bufL._4_4_;
        }
      }
      if (*(int *)((long)chip + (long)sample * 4 + 0x5e0) < 1) {
        if (*(int *)((long)chip + (long)sample * 4 + 0x5e0) < 0) {
          *(int *)((long)chip + (long)sample * 4 + 0x5e0) =
               *(int *)((long)chip + (long)sample * 4 + 0x5e0) + 1;
        }
      }
      else {
        *(int *)((long)chip + (long)sample * 4 + 0x5e0) =
             *(int *)((long)chip + (long)sample * 4 + 0x5e0) + -1;
      }
      if (*(int *)((long)chip + (long)sample * 4 + 0x600) < 1) {
        if (*(int *)((long)chip + (long)sample * 4 + 0x600) < 0) {
          *(int *)((long)chip + (long)sample * 4 + 0x600) =
               *(int *)((long)chip + (long)sample * 4 + 0x600) + 1;
        }
      }
      else {
        *(int *)((long)chip + (long)sample * 4 + 0x600) =
             *(int *)((long)chip + (long)sample * 4 + 0x600) + -1;
      }
      smp = *(int *)((long)chip + (long)sample * 4 + 0x5e0) + smp;
      bufL._4_4_ = *(int *)((long)chip + (long)sample * 4 + 0x600) + bufL._4_4_;
    }
    pDVar1[(uint)sampleAllL] = (int)((double)smp * *(double *)((long)chip + 0x648));
    pDVar2[(uint)sampleAllL] = (int)((double)bufL._4_4_ * *(double *)((long)chip + 0x648));
  }
  return;
}

Assistant:

static void
OPSG_Mix(
	void*		chip,
	UINT32		nSample,	// 書き出すサンプル数
	DEV_SMPL**	pDst)		// 出力先バッファ //Kitao更新。PSG専用バッファにしたためSint16に。
{
	huc6280_state* info = (huc6280_state*)chip;
	PSG*		PSGChn;
	Sint32		i;
	Uint32		j;
	Sint32		sample; //Kitao追加
	Sint32		sampleAllL; //Kitao追加。6chぶんのサンプルを足していくためのバッファ。精度を維持するために必要。6chぶん合計が終わった後に、これをSint16に変換して書き込むようにした。
	Sint32		sampleAllR; //Kitao追加。上のＲチャンネル用
	Sint32		smp; //Kitao追加。DDA音量,ノイズ音量計算用
	DEV_SMPL*	bufL = pDst[0];
	DEV_SMPL*	bufR = pDst[1];

	for (j=0; j<nSample; j++)
	{
		sampleAllL = 0;
		sampleAllR = 0;
		for (i=0; i<N_CHANNEL; i++)
		{
			PSGChn = &info->Psg[i];
			
			if ((PSGChn->bOn)&&((i != 1)||(info->LfoCtrl == 0))&&(!info->bPsgMute[i])) //Kitao更新
			{
				if (PSGChn->bDDA)
				{
					smp = PSGChn->ddaSample * PSGChn->outVolumeL;
					//smp = PSGChn->ddaSample * PSGChn->outVolumeL * (Sint32)OVERSAMPLE_RATE; //オーバーサンプリング用
					sampleAllL += smp + (smp >> 3) + (smp >> 4) + (smp >> 5) + (smp >> 7) + (smp >> 12) + (smp >> 14) + (smp >> 15); //Kitao更新。サンプリング音の音量を実機並みに調整。v2.39,v2.40,v2.62,v2.65再調整した。
					smp = PSGChn->ddaSample * PSGChn->outVolumeR;
					//smp = PSGChn->ddaSample * PSGChn->outVolumeR * (Sint32)OVERSAMPLE_RATE; //オーバーサンプリング用
					sampleAllR += smp + (smp >> 3) + (smp >> 4) + (smp >> 5) + (smp >> 7) + (smp >> 12) + (smp >> 14) + (smp >> 15); //Kitao更新。サンプリング音の音量を実機並みに調整。v2.39,v2.40,v2.62,v2.65再調整した。
				}
				else if (PSGChn->bNoiseOn)
				{
					sample = _NoiseTable[PSGChn->phase >> 17];
					PSGChn->phase += PSGChn->deltaNoisePhase; //Kitao更新
					/*
					for (k = 2; k<=OVERSAMPLE_RATE; k++) //オーバーサンプリング用
					{
						sample += _NoiseTable[PSGChn->phase>>17];
						PSGChn->phase += PSGChn->deltaNoisePhase;
					}
					*/
					
					if (PSGChn->noiseFrq == 0) //Kitao追加。noiseFrq=0(dataに0x1Fが書き込まれた)のときは音量が通常の半分とした。（ファイヤープロレスリング３、パックランド、桃太郎活劇、がんばれゴルフボーイズなど）
					{
						smp = sample * PSGChn->outVolumeL;
						sampleAllL += (smp >> 1) + (smp >> 12) + (smp >> 14); //(1/2 + 1/4096 + (1/32768 + 1/32768))
						smp = sample * PSGChn->outVolumeR;
						sampleAllR += (smp >> 1) + (smp >> 12) + (smp >> 14);
					}
					else //通常
					{
						smp = sample * PSGChn->outVolumeL;
						sampleAllL += smp + (smp >> 11) + (smp >> 14) + (smp >> 15); //Kitao更新。ノイズの音量を実機並みに調整(1 + 1/2048 + 1/16384 + 1/32768)。この"+1/32768"で絶妙(主観。大魔界村,ソルジャーブレイドなど)になる。v2.62更新
						smp = sample * PSGChn->outVolumeR;
						sampleAllR += smp + (smp >> 11) + (smp >> 14) + (smp >> 15); //Kitao更新。ノイズの音量を実機並みに調整
					}
				}
				else if (PSGChn->deltaPhase)
				{
					//Kitao更新。オーバーサンプリングしないようにした。
					sample = PSGChn->wave[PSGChn->phase >> 27];
					inc_phase(info, i); //v2.73更新
					/*
					for (k = 2; k<=OVERSAMPLE_RATE; k++) //オーバーサンプリング用
					{
						sample += PSGChn->wave[PSGChn->phase >> 27];
						inc_phase(i); //v2.73更新
					}
					*/
					if (PSGChn->frq < 128)
						sample -= sample >> 2; //低周波域の音量を制限。ブラッドギアのスタート時などで実機と同様の音に。ソルジャーブレイドなども実機に近くなった。v2.03

					sampleAllL += sample * PSGChn->outVolumeL; //Kitao更新
					sampleAllR += sample * PSGChn->outVolumeR; //Kitao更新
				}
			}
			//Kitao追加。DDA消音時はノイズ軽減のためフェードアウトで消音する。
			//			 ベラボーマン(「わしがばくだはかせじゃ」から数秒後)やパワーテニス(タイトル曲終了から数秒後。点数コール)，将棋初心者無用(音声)等で効果あり。
			if (info->DdaFadeOutL[i] > 0)
				--info->DdaFadeOutL[i];
			else if (info->DdaFadeOutL[i] < 0)
				++info->DdaFadeOutL[i];
			if (info->DdaFadeOutR[i] > 0)
				--info->DdaFadeOutR[i];
			else if (info->DdaFadeOutR[i] < 0)
				++info->DdaFadeOutR[i];
			sampleAllL += info->DdaFadeOutL[i];
			//sampleAllL += info->DdaFadeOutL[i] * OVERSAMPLE_RATE; //オーバーサンプリング用
			sampleAllR += info->DdaFadeOutR[i];
			//sampleAllR += info->DdaFadeOutR[i] * OVERSAMPLE_RATE; //オーバーサンプリング用
		}
		//Kitao更新。6ch合わさったところで、ボリューム調整してバッファに書き込む。
		bufL[j] = (DEV_SMPL)((double)sampleAllL * info->VOL);
		bufR[j] = (DEV_SMPL)((double)sampleAllR * info->VOL);
		
#ifdef ENABLE_QUEUE
		//キューを参照しPSGレジスタを更新する。Kitao更新。高速化のためサブルーチンにせずここで処理。キューの参照はシンプルにした(テンポの安定性向上)。
		while (_QueueReadIndex != _QueueWriteIndex) //v1.10更新。キュー処理をここへ統合し高速化。
		{
			write_reg(_Queue[_QueueReadIndex].reg, _Queue[_QueueReadIndex].data);
			_QueueReadIndex++; //Kitao更新
			_QueueReadIndex &= APUQUEUE_SIZE-1; //Kitao更新
		}
#endif
	}
}